

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O0

int run_test_tcp_close_after_read_timeout(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_loop_t *loop;
  uv_tcp_t tcp_server;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&tcp_server.queued_fds);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0x96,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  start_server(loop_00,(uv_tcp_t *)&loop);
  iVar1 = uv_tcp_init(loop_00,&client);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0x9e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_connect(&connect_req,&client,&tcp_server.queued_fds,on_client_connect);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xa4,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_init(loop_00,&connection);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xa7,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_init(loop_00,&timer);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xaa,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)read_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xac,"read_cb_called","==","0",(long)read_cb_called,"==",0);
    abort();
  }
  if ((long)on_close_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xad,"on_close_called","==","0",(long)on_close_called,"==",0);
    abort();
  }
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xb0,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)read_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xb2,"1","==","read_cb_called",1,"==",(long)read_cb_called);
    abort();
  }
  if ((long)on_close_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xb3,"3","==","on_close_called",3,"==",(long)on_close_called);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0xb5,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_close_after_read_timeout) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     on_client_connect);
  ASSERT_OK(r);

  r = uv_tcp_init(loop, &connection);
  ASSERT_OK(r);

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  ASSERT_OK(read_cb_called);
  ASSERT_OK(on_close_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(3, on_close_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}